

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_h_predictor_8x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  long lVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  lVar1 = 0;
  do {
    auVar9 = *(undefined1 (*) [16])(left + lVar1);
    auVar13._0_14_ = auVar9._0_14_;
    auVar13[0xe] = auVar9[7];
    auVar13[0xf] = auVar9[7];
    auVar6._14_2_ = auVar13._14_2_;
    auVar6._0_13_ = auVar9._0_13_;
    auVar6[0xd] = auVar9[6];
    auVar5._13_3_ = auVar6._13_3_;
    auVar5._0_12_ = auVar9._0_12_;
    auVar5[0xc] = auVar9[6];
    auVar4._12_4_ = auVar5._12_4_;
    auVar4._0_11_ = auVar9._0_11_;
    auVar4[0xb] = auVar9[5];
    auVar11._11_5_ = auVar4._11_5_;
    auVar11._0_10_ = auVar9._0_10_;
    auVar11[10] = auVar9[5];
    auVar3._10_6_ = auVar11._10_6_;
    auVar3._0_9_ = auVar9._0_9_;
    auVar3[9] = auVar9[4];
    auVar12._9_7_ = auVar3._9_7_;
    auVar12._0_8_ = auVar9._0_8_;
    auVar12[8] = auVar9[4];
    auVar10._8_8_ = auVar12._8_8_;
    auVar10[7] = auVar9[3];
    auVar10[6] = auVar9[3];
    auVar10[5] = auVar9[2];
    auVar10[4] = auVar9[2];
    auVar10[3] = auVar9[1];
    auVar10[2] = auVar9[1];
    auVar10[1] = auVar9[0];
    auVar10[0] = auVar9[0];
    auVar2[1] = auVar9[8];
    auVar2[0] = auVar9[8];
    auVar2[2] = auVar9[9];
    auVar2[3] = auVar9[9];
    auVar2[4] = auVar9[10];
    auVar2[5] = auVar9[10];
    auVar2[6] = auVar9[0xb];
    auVar2[7] = auVar9[0xb];
    auVar2[8] = auVar9[0xc];
    auVar2[9] = auVar9[0xc];
    auVar2[10] = auVar9[0xd];
    auVar2[0xb] = auVar9[0xd];
    auVar8[0xc] = auVar9[0xe];
    auVar8._0_12_ = auVar2;
    auVar8[0xd] = auVar9[0xe];
    auVar8[0xf] = auVar9[0xf];
    auVar8[0xe] = auVar8[0xf];
    auVar9 = pshuflw(in_XMM2,auVar10,0);
    auVar11 = pshuflw(in_XMM3,auVar10,0x55);
    auVar13 = pshuflw(in_XMM4,auVar10,0xaa);
    in_XMM5 = pshuflw(in_XMM5,auVar10,0xff);
    *(long *)dst = auVar9._0_8_;
    *(long *)(dst + stride) = auVar11._0_8_;
    *(long *)(dst + stride * 2) = auVar13._0_8_;
    *(long *)(dst + stride * 3) = in_XMM5._0_8_;
    auVar7._8_4_ = auVar12._8_4_;
    auVar7._0_8_ = auVar10._8_8_;
    auVar7._12_4_ = auVar4._12_4_;
    auVar10 = pshuflw(auVar9,auVar7,0);
    auVar12 = pshuflw(auVar11,auVar7,0x55);
    auVar13 = pshuflw(auVar13,auVar7,0xaa);
    auVar9 = pshuflw(auVar7,auVar7,0xff);
    *(long *)(dst + stride * 4) = auVar10._0_8_;
    *(long *)(dst + stride * 5) = auVar12._0_8_;
    *(long *)(dst + stride * 6) = auVar13._0_8_;
    *(long *)(dst + stride * 7) = auVar9._0_8_;
    auVar11 = pshuflw(auVar9,auVar8,0);
    auVar10 = pshuflw(auVar10,auVar8,0x55);
    auVar12 = pshuflw(auVar12,auVar8,0xaa);
    in_XMM4 = pshuflw(auVar13,auVar8,0xff);
    *(long *)(dst + stride * 8) = auVar11._0_8_;
    *(long *)(dst + stride * 9) = auVar10._0_8_;
    *(long *)(dst + stride * 10) = auVar12._0_8_;
    *(long *)(dst + stride * 0xb) = in_XMM4._0_8_;
    auVar9._8_4_ = auVar2._8_4_;
    auVar9._12_4_ = auVar8._12_4_;
    auVar9._4_4_ = auVar9._12_4_;
    auVar9._0_4_ = auVar9._8_4_;
    auVar8 = pshuflw(auVar11,auVar9,0);
    in_XMM2 = pshuflw(auVar10,auVar9,0x55);
    in_XMM3 = pshuflw(auVar12,auVar9,0xaa);
    auVar9 = pshuflw(auVar9,auVar9,0xff);
    *(long *)(dst + stride * 0xc) = auVar8._0_8_;
    *(long *)(dst + stride * 0xd) = in_XMM2._0_8_;
    *(long *)(dst + stride * 0xe) = in_XMM3._0_8_;
    *(long *)(dst + stride * 0xf) = auVar9._0_8_;
    lVar1 = lVar1 + 0x10;
    dst = dst + stride * 0x10;
  } while ((int)lVar1 != 0x20);
  return;
}

Assistant:

void aom_h_predictor_8x32_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  h_predictor_8x16xc(dst, stride, above, left, 2);
}